

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O2

int __thiscall TPZCheckMesh::CheckConnectSeqNumberConsistency(TPZCheckMesh *this)

{
  uint uVar1;
  TPZConnect *pTVar2;
  ostream *poVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  int64_t ic;
  ulong uVar8;
  
  uVar6 = (this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  if ((long)uVar6 < 1) {
    uVar6 = 0;
  }
  lVar7 = 0;
  for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    pTVar2 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,uVar8);
    uVar4 = 0;
    if (pTVar2->fNElConnected != 0) {
      uVar4 = (ulong)(pTVar2->field_2).fCompose.fIsCondensed ^ 1;
    }
    if (pTVar2->fDependList != (TPZDepend *)0x0) {
      uVar4 = 0;
    }
    lVar7 = lVar7 + uVar4;
  }
  if (lVar7 == 0) {
    uVar1 = 0;
  }
  else {
    bVar5 = 0;
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      pTVar2 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,uVar8);
      if ((((pTVar2->fDependList != (TPZDepend *)0x0) || (pTVar2->fNElConnected == 0)) ||
          ((pTVar2->field_2).fCompose.fIsCondensed == true)) &&
         (pTVar2->fSequenceNumber != -1 && pTVar2->fSequenceNumber < lVar7)) {
        poVar3 = std::operator<<(this->fOut,"Connect index ");
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        poVar3 = std::operator<<(poVar3," has inconsistent sequence number ");
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        poVar3 = std::operator<<(poVar3," nindependent connects ");
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        bVar5 = 1;
      }
    }
    uVar1 = (uint)bVar5;
  }
  return uVar1;
}

Assistant:

int TPZCheckMesh::CheckConnectSeqNumberConsistency()
{
    bool wrong = false;
    int64_t numindepconnect = 0;
    int64_t nconnect = fMesh->NConnects();
    for (int64_t ic=0; ic<nconnect; ic++) {
        TPZConnect &c = fMesh->ConnectVec()[ic];
        if (!c.HasDependency() && c.NElConnected() && !c.IsCondensed()) {
            numindepconnect++;
        }
    }
    if (numindepconnect == 0) {
        return 0;
    }
    for (int64_t ic=0; ic<nconnect; ic++) {
        TPZConnect &c = fMesh->ConnectVec()[ic];
        if (c.HasDependency() || !c.NElConnected() || c.IsCondensed()) {
            int64_t seqnum = c.SequenceNumber();
            if (seqnum < numindepconnect && seqnum != -1) { // @omar need more information about this case seqnum != -1
                *fOut << "Connect index " << ic << " has inconsistent sequence number " << seqnum << " nindependent connects " << numindepconnect << std::endl;
                wrong = true;
            }
        }
    }
    if (wrong == false) {
        return 0;
    }
    else
    {
        return 1;
    }
}